

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall H264StreamReader::processSEI(H264StreamReader *this,uint8_t *buff)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer ppVar6;
  reference piVar7;
  uchar *puVar8;
  VodCoreException *pVVar9;
  byte local_1171;
  string local_1158;
  ostringstream local_1138 [8];
  ostringstream ss_1;
  int sizeDiff;
  ostringstream local_f98 [8];
  ostringstream ss;
  uint8_t local_e18 [4];
  int newSize;
  uint8_t tmpBuff [3072];
  int oldSize;
  int *msg;
  iterator __end2;
  iterator __begin2;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range2;
  bool nonTimingSEI;
  iterator iStack_1e0;
  bool timingSEI;
  int local_1d8;
  uint8_t *local_1c8;
  uint8_t *nextNal;
  SEIUnit lastSEI;
  uint8_t *buff_local;
  H264StreamReader *this_local;
  
  lastSEI.m_mvcHeaderStart = buff;
  bVar2 = std::
          map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
          ::empty(&this->m_spsMap);
  if (!bVar2) {
    SEIUnit::SEIUnit((SEIUnit *)&nextNal);
    local_1c8 = NALUnit::findNALWithStartCode
                          (lastSEI.m_mvcHeaderStart,
                           (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
    if (local_1c8 == (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd) {
      this_local._4_4_ = -10;
      local_1d8 = 1;
    }
    else if ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd < local_1c8 + 4) {
      this_local._4_4_ = -10;
      local_1d8 = 1;
    }
    else {
      lastSEI.super_NALUnit.bitReader.m_curVal._0_1_ = -1;
      NALUnit::decodeBuffer((NALUnit *)&nextNal,lastSEI.m_mvcHeaderStart,local_1c8);
      iStack_1e0 = std::
                   map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
                   ::begin(&this->m_spsMap);
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator->
                         (&stack0xfffffffffffffe20);
      local_1171 = 1;
      if ((this->orig_hrd_parameters_present_flag & 1U) == 0) {
        local_1171 = this->orig_vcl_parameters_present_flag;
      }
      SEIUnit::deserialize((SEIUnit *)&nextNal,ppVar6->second,local_1171 & 1);
      bVar2 = false;
      bVar1 = false;
      __end2 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
               begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )&lastSEI.pic_struct);
      msg = (int *)std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   ::end((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)&lastSEI.pic_struct);
      while (bVar3 = std::__detail::operator!=
                               (&__end2.super__Node_iterator_base<int,_false>,
                                (_Node_iterator_base<int,_false> *)&msg), bVar3) {
        piVar7 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end2);
        if (*piVar7 == 0) {
          bVar2 = true;
        }
        else if (*piVar7 == 1) {
          bVar2 = true;
          this->m_lastPictStruct = (int8_t)lastSEI.super_NALUnit.bitReader.m_curVal;
        }
        else if (*piVar7 != 0x25) {
          bVar1 = true;
        }
        std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end2);
      }
      if ((this->m_mvcSubStream & 1U) != 0) {
        if (-1 < lastSEI.initial_cpb_removal_delay_offset[0x1e]) {
          if ((this->m_needSeiCorrection & 1U) == 0) {
            this->m_priorityNalAddr = lastSEI.m_mvcHeaderStart;
            this->m_OffsetMetadataPtsAddr =
                 lastSEI.m_mvcHeaderStart + lastSEI.initial_cpb_removal_delay_offset[0x1f];
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&this->m_bdRomMetaDataMsg,(ulong)(uint)lastSEI.super_NALUnit.m_nalBuffer);
            this->m_bdRomMetaDataMsgPtsPos = lastSEI.initial_cpb_removal_delay_offset[0x1f];
            puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&this->m_bdRomMetaDataMsg);
            memcpy(puVar8,(void *)lastSEI.super_NALUnit._8_8_,
                   (ulong)(uint)lastSEI.super_NALUnit.m_nalBuffer);
          }
        }
        if ((bVar2) && (0 < lastSEI.number_of_offset_sequences)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&this->m_lastSeiMvcHeader,(long)lastSEI.number_of_offset_sequences);
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&this->m_lastSeiMvcHeader);
          memcpy(puVar8,(void *)lastSEI._400_8_,(long)lastSEI.number_of_offset_sequences);
        }
      }
      if ((!bVar2) || (bVar1)) {
        if ((bVar2) && ((bVar1 && ((this->m_needSeiCorrection & 1U) != 0)))) {
          iVar4 = (int)local_1c8 - (int)lastSEI.m_mvcHeaderStart;
          tmpBuff._3064_8_ =
               std::
               map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
               ::begin(&this->m_spsMap);
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_> *)
                              (tmpBuff + 0xbf8));
          SEIUnit::removePicTimingSEI((SEIUnit *)&nextNal,ppVar6->second);
          iVar5 = NALUnit::serializeBuffer((NALUnit *)&nextNal,local_e18,tmpBuff + 0xbf8,false);
          if (iVar5 == -1) {
            std::__cxx11::ostringstream::ostringstream(local_f98);
            std::operator<<((ostream *)local_f98,"Not enough buffer");
            pVVar9 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar9,3,(string *)&sizeDiff);
            __cxa_throw(pVVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if (iVar5 < 3) {
            __assert_fail("newSize > 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/h264StreamReader.cpp"
                          ,0x3e6,"int H264StreamReader::processSEI(uint8_t *)");
          }
          iVar4 = iVar5 - iVar4;
          if (iVar4 != 0) {
            if ((this->super_MPEGStreamReader).m_tmpBuffer + 0x800000 <
                (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + iVar4) {
              std::__cxx11::ostringstream::ostringstream(local_1138);
              std::operator<<((ostream *)local_1138,"Not enough buffer");
              pVVar9 = (VodCoreException *)__cxa_allocate_exception(0x28);
              std::__cxx11::ostringstream::str();
              VodCoreException::VodCoreException(pVVar9,3,&local_1158);
              __cxa_throw(pVVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            memmove(local_1c8 + iVar4,local_1c8,
                    (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
                    (long)local_1c8);
            (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd =
                 (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + iVar4;
          }
          memcpy(lastSEI.m_mvcHeaderStart,local_e18,(long)iVar5);
        }
        local_1d8 = 0;
      }
      else {
        this_local._4_4_ = 0;
        local_1d8 = 1;
      }
    }
    SEIUnit::~SEIUnit((SEIUnit *)&nextNal);
    if (local_1d8 != 0) {
      return this_local._4_4_;
    }
  }
  return 0;
}

Assistant:

int H264StreamReader::processSEI(uint8_t *buff)
{
    if (!m_spsMap.empty())
    {
        SEIUnit lastSEI;
        uint8_t *nextNal = NALUnit::findNALWithStartCode(buff, m_bufEnd, true);
        if (nextNal == m_bufEnd)
            return NOT_ENOUGH_BUFFER;
        if (nextNal + 4 > m_bufEnd)
            return NOT_ENOUGH_BUFFER;
        lastSEI.pic_struct = -1;
        lastSEI.decodeBuffer(buff, nextNal);
        lastSEI.deserialize(*(m_spsMap.begin()->second),
                            orig_hrd_parameters_present_flag || orig_vcl_parameters_present_flag);

        bool timingSEI = false;
        bool nonTimingSEI = false;
        for (auto &msg : lastSEI.m_processedMessages)
        {
            if (msg == SEI_MSG_BUFFERING_PERIOD)
            {
                timingSEI = true;
            }
            else if (msg == SEI_MSG_PIC_TIMING)
            {
                timingSEI = true;
                m_lastPictStruct = lastSEI.pic_struct;
            }
            else if (msg == SEI_MSG_MVC_SCALABLE_NESTING)
            {
            }
            else
            {
                nonTimingSEI = true;
            }
        }

        if (m_mvcSubStream)
        {
            if (lastSEI.number_of_offset_sequences >= 0)
            {
                if (m_needSeiCorrection)
                {
                    // copy to buffer, then isert sei
                    m_bdRomMetaDataMsg.resize(lastSEI.m_nalBufferLen);
                    m_bdRomMetaDataMsgPtsPos = lastSEI.metadataPtsOffset;
                    memcpy(m_bdRomMetaDataMsg.data(), lastSEI.m_nalBuffer, lastSEI.m_nalBufferLen);
                }
                else
                {
                    // update inplace
                    m_priorityNalAddr = buff;
                    m_OffsetMetadataPtsAddr = lastSEI.metadataPtsOffset + buff;
                }
            }

            if (timingSEI && lastSEI.m_mvcHeaderLen > 0)
            {
                m_lastSeiMvcHeader.resize(lastSEI.m_mvcHeaderLen);
                memcpy(m_lastSeiMvcHeader.data(), lastSEI.m_mvcHeaderStart, lastSEI.m_mvcHeaderLen);
            }
        }

        if (timingSEI && !nonTimingSEI)

            return 0;

        if (timingSEI && nonTimingSEI && m_needSeiCorrection)
        {
            // remove timing part from muxed SEI
            int oldSize = static_cast<int>(nextNal - buff);
            lastSEI.removePicTimingSEI(*(m_spsMap.begin()->second));

            uint8_t tmpBuff[1024 * 3];
            int newSize = lastSEI.serializeBuffer(tmpBuff, tmpBuff + sizeof(tmpBuff), false);
            if (newSize == -1)
                THROW(ERR_COMMON, "Not enough buffer")

            assert(newSize > 2);

            int sizeDiff = newSize - oldSize;
            if (sizeDiff != 0)
            {
                if (m_bufEnd + sizeDiff > m_tmpBuffer + TMP_BUFFER_SIZE)
                    THROW(ERR_COMMON, "Not enough buffer")
                memmove(nextNal + sizeDiff, nextNal, m_bufEnd - nextNal);
                m_bufEnd += sizeDiff;
            }
            memcpy(buff, tmpBuff, newSize);
        }
    }
    return 0;
}